

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

void Assimp::FBX::ParseVectorDataArray(vector<int,_std::allocator<int>_> *out,Element *el)

{
  bool bVar1;
  const_reference ppTVar2;
  Element *pEVar3;
  TokenList *pTVar4;
  reference ppTVar5;
  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
  local_120;
  int local_114;
  const_iterator cStack_110;
  int ival;
  const_iterator end_1;
  const_iterator it;
  string local_f8;
  Element *local_d8;
  Element *a;
  Scope *scope;
  size_t dim;
  int32_t val;
  uint i;
  int32_t *ip;
  vector<char,_std::allocator<char>_> buff;
  string local_90;
  uint32_t local_70;
  char local_69;
  uint32_t count;
  char type;
  char *end;
  char *data;
  allocator<char> local_41;
  string local_40;
  vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *local_20;
  TokenList *tok;
  Element *el_local;
  vector<int,_std::allocator<int>_> *out_local;
  
  tok = (TokenList *)el;
  el_local = (Element *)out;
  std::vector<int,_std::allocator<int>_>::resize(out,0);
  local_20 = Element::Tokens((Element *)tok);
  bVar1 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
          empty(local_20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"unexpected empty element",&local_41);
    anon_unknown.dwarf_cdd617::ParseError(&local_40,(Element *)tok);
  }
  ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            operator[](local_20,0);
  bVar1 = Token::IsBinary(*ppTVar2);
  if (bVar1) {
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[](local_20,0);
    end = Token::begin(*ppTVar2);
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[](local_20,0);
    _count = Token::end(*ppTVar2);
    anon_unknown_16::ReadBinaryDataArrayHead(&end,_count,&local_69,&local_70,(Element *)tok);
    if (local_70 != 0) {
      if (local_69 != 'i') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"expected int array (binary)",
                   (allocator<char> *)
                   &buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
        anon_unknown.dwarf_cdd617::ParseError(&local_90,(Element *)tok);
      }
      std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&ip);
      anon_unknown_16::ReadBinaryDataArray
                (local_69,local_70,&end,_count,(vector<char,_std::allocator<char>_> *)&ip,
                 (Element *)tok);
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)el_local,(ulong)local_70);
      _val = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&ip,0);
      for (dim._4_4_ = 0; dim._4_4_ < local_70; dim._4_4_ = dim._4_4_ + 1) {
        dim._0_4_ = *(undefined4 *)_val;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)el_local,(value_type_conflict4 *)&dim);
        _val = _val + 4;
      }
      std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&ip);
    }
  }
  else {
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[](local_20,0);
    scope = (Scope *)ParseTokenAsDim(*ppTVar2);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)el_local,(size_type)scope);
    pEVar3 = (Element *)GetRequiredScope((Element *)tok);
    a = pEVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"a",(allocator<char> *)((long)&it._M_current + 7));
    pEVar3 = GetRequiredElement((Scope *)pEVar3,&local_f8,(Element *)tok);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    local_d8 = pEVar3;
    pTVar4 = Element::Tokens(pEVar3);
    end_1 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            begin(pTVar4);
    pTVar4 = Element::Tokens(local_d8);
    cStack_110 = std::
                 vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
                 end(pTVar4);
    while (bVar1 = __gnu_cxx::operator!=(&end_1,&stack0xfffffffffffffef0), bVar1) {
      local_120 = __gnu_cxx::
                  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                  ::operator++(&end_1,0);
      ppTVar5 = __gnu_cxx::
                __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                ::operator*(&local_120);
      local_114 = ParseTokenAsInt(*ppTVar5);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)el_local,&local_114);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<int>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(!count) {
            return;
        }

        if (type != 'i') {
            ParseError("expected int array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * 4);

        out.reserve(count);

        const int32_t* ip = reinterpret_cast<const int32_t*>(&buff[0]);
        for (unsigned int i = 0; i < count; ++i, ++ip) {
            BE_NCONST int32_t val = *ip;
            AI_SWAP4(val);
            out.push_back(val);
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // see notes in ParseVectorDataArray()
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        const int ival = ParseTokenAsInt(**it++);
        out.push_back(ival);
    }
}